

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

Matrix<double> __thiscall Matrix<double>::Inverse(Matrix<double> *this)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  double **extraout_RDX;
  int *in_RSI;
  Matrix<double> *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Matrix<double> MVar6;
  int local_90;
  int local_8c;
  int j_2;
  int i_4;
  int local_80;
  int columMod;
  int rowMod;
  int k_3;
  int i_3;
  int j_1;
  double c;
  int k_2;
  double tmp;
  int k_1;
  int k;
  int maxRow;
  double local_40;
  double maxEl;
  int i_2;
  int i_1;
  int j;
  int i;
  Matrix<double> A;
  Matrix<double> *this_local;
  Matrix<double> *Inv;
  
  this_00 = (Matrix<double> *)&j;
  Matrix(this_00,*in_RSI,*in_RSI << 1);
  for (i_1 = 0; i_1 < *in_RSI; i_1 = i_1 + 1) {
    for (i_2 = 0; i_2 < *in_RSI; i_2 = i_2 + 1) {
      *(undefined8 *)(*(long *)(A._0_8_ + (long)i_1 * 8) + (long)i_2 * 8) =
           *(undefined8 *)(*(long *)(*(long *)(in_RSI + 2) + (long)i_1 * 8) + (long)i_2 * 8);
    }
  }
  for (maxEl._4_4_ = 0; maxEl._4_4_ < *in_RSI; maxEl._4_4_ = maxEl._4_4_ + 1) {
    *(undefined8 *)(*(long *)(A._0_8_ + (long)maxEl._4_4_ * 8) + (long)(*in_RSI + maxEl._4_4_) * 8)
         = 0x3ff0000000000000;
  }
  for (maxEl._0_4_ = 0; maxEl._0_4_ < *in_RSI; maxEl._0_4_ = maxEl._0_4_ + 1) {
    std::abs((int)this_00);
    k_1 = maxEl._0_4_;
    local_40 = extraout_XMM0_Qa;
    tmp._4_4_ = maxEl._0_4_;
    while (tmp._4_4_ = tmp._4_4_ + 1, tmp._4_4_ < *in_RSI) {
      std::abs((int)this_00);
      if (local_40 < extraout_XMM0_Qa_00) {
        local_40 = *(double *)(*(long *)(A._0_8_ + (long)tmp._4_4_ * 8) + (long)maxEl._0_4_ * 8);
        k_1 = tmp._4_4_;
      }
    }
    for (tmp._0_4_ = maxEl._0_4_; c._4_4_ = maxEl._0_4_,
        SBORROW4(tmp._0_4_,*in_RSI * 2) != tmp._0_4_ + *in_RSI * -2 < 0; tmp._0_4_ = tmp._0_4_ + 1)
    {
      uVar1 = *(undefined8 *)(*(long *)(A._0_8_ + (long)k_1 * 8) + (long)tmp._0_4_ * 8);
      *(undefined8 *)(*(long *)(A._0_8_ + (long)k_1 * 8) + (long)tmp._0_4_ * 8) =
           *(undefined8 *)(*(long *)(A._0_8_ + (long)maxEl._0_4_ * 8) + (long)tmp._0_4_ * 8);
      *(undefined8 *)(*(long *)(A._0_8_ + (long)maxEl._0_4_ * 8) + (long)tmp._0_4_ * 8) = uVar1;
    }
    while (c._4_4_ = c._4_4_ + 1, c._4_4_ < *in_RSI) {
      dVar2 = *(double *)(*(long *)(A._0_8_ + (long)c._4_4_ * 8) + (long)maxEl._0_4_ * 8);
      dVar3 = *(double *)(*(long *)(A._0_8_ + (long)maxEl._0_4_ * 8) + (long)maxEl._0_4_ * 8);
      for (k_3 = maxEl._0_4_; SBORROW4(k_3,*in_RSI * 2) != k_3 + *in_RSI * -2 < 0; k_3 = k_3 + 1) {
        if (maxEl._0_4_ == k_3) {
          *(undefined8 *)(*(long *)(A._0_8_ + (long)c._4_4_ * 8) + (long)k_3 * 8) = 0;
        }
        else {
          lVar4 = *(long *)(A._0_8_ + (long)c._4_4_ * 8);
          *(double *)(lVar4 + (long)k_3 * 8) =
               (-dVar2 / dVar3) *
               *(double *)(*(long *)(A._0_8_ + (long)maxEl._0_4_ * 8) + (long)k_3 * 8) +
               *(double *)(lVar4 + (long)k_3 * 8);
        }
      }
    }
  }
  iVar5 = *in_RSI;
  while (rowMod = iVar5 + -1, -1 < rowMod) {
    for (columMod = *in_RSI; SBORROW4(columMod,*in_RSI * 2) != columMod + *in_RSI * -2 < 0;
        columMod = columMod + 1) {
      lVar4 = *(long *)(A._0_8_ + (long)rowMod * 8);
      *(double *)(lVar4 + (long)columMod * 8) =
           *(double *)(lVar4 + (long)columMod * 8) /
           *(double *)(*(long *)(A._0_8_ + (long)rowMod * 8) + (long)rowMod * 8);
    }
    for (local_80 = iVar5 + -2; iVar5 = rowMod, -1 < local_80; local_80 = local_80 + -1) {
      for (i_4 = *in_RSI; SBORROW4(i_4,*in_RSI * 2) != i_4 + *in_RSI * -2 < 0; i_4 = i_4 + 1) {
        lVar4 = *(long *)(A._0_8_ + (long)local_80 * 8);
        *(double *)(lVar4 + (long)i_4 * 8) =
             -*(double *)(*(long *)(A._0_8_ + (long)rowMod * 8) + (long)i_4 * 8) *
             *(double *)(*(long *)(A._0_8_ + (long)local_80 * 8) + (long)rowMod * 8) +
             *(double *)(lVar4 + (long)i_4 * 8);
      }
    }
  }
  Matrix(this,*in_RSI,*in_RSI);
  for (local_8c = 0; local_8c < *in_RSI; local_8c = local_8c + 1) {
    for (local_90 = 0; local_90 < *in_RSI; local_90 = local_90 + 1) {
      this->M[local_8c][local_90] =
           *(double *)(*(long *)(A._0_8_ + (long)local_8c * 8) + (long)(local_90 + *in_RSI) * 8);
    }
  }
  ~Matrix((Matrix<double> *)&j);
  MVar6.M = extraout_RDX;
  MVar6._0_8_ = this;
  return MVar6;
}

Assistant:

Matrix Inverse() const {
    Matrix<T> A(n, 2 * n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        A.M[i][j] = M[i][j];
      }
    }
    for (int i = 0; i < n; i++) {
      A.M[i][n + i] = 1;
    }

    for (int i = 0; i < n; i++) {
      double maxEl = abs(A.M[i][i]);
      int maxRow = i;
      for (int k = i + 1; k < n; k++) {
        if (abs(A.M[k][i]) > maxEl) {
          maxEl = A.M[k][i];
          maxRow = k;
        }
      }

      for (int k = i; k < 2 * n; k++) {
        double tmp = A.M[maxRow][k];
        A.M[maxRow][k] = A.M[i][k];
        A.M[i][k] = tmp;
      }

      for (int k = i + 1; k < n; k++) {
        double c = -A.M[k][i] / A.M[i][i];
        for (int j = i; j < 2 * n; j++) {
          if (i == j) {
            A.M[k][j] = 0;
          } else {
            A.M[k][j] += c * A.M[i][j];
          }
        }
      }
    }

    for (int i = n - 1; i >= 0; i--) {
      for (int k = n; k < 2 * n; k++) {
        A.M[i][k] /= A.M[i][i];
      }
      for (int rowMod = i - 1; rowMod >= 0; rowMod--) {
        for (int columMod = n; columMod < 2 * n; columMod++) {
          A.M[rowMod][columMod] -= A.M[i][columMod] * A.M[rowMod][i];
        }
      }
    }

    Matrix<T> Inv(n, n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        Inv.M[i][j] = A.M[i][j + n];
      }
    }
    return Inv;
  }